

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_squared_Test::TestBody(unitStrings_squared_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unit_data uVar2;
  precise_unit *ppVar3;
  uint64_t in_RCX;
  string *psVar4;
  char *pcVar5;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  AssertHelper local_58;
  unit_data local_50;
  undefined4 local_4c;
  string local_48;
  float local_24;
  undefined8 local_20;
  
  local_24 = units::detail::power_const<float>(0.3048,2);
  units::detail::unit_data::pow
            ((unit_data *)((long)&units::ft + 4),(double)CONCAT44(extraout_XMM0_Db,local_24),
             in_XMM1_Qa);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_58.data_ = (AssertHelperData *)(double)local_24;
  local_4c = 0;
  psVar4 = &local_48;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_58,ppVar3,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_68,"to_string(ft.pow(2))","\"ft^2\"",psVar4,(char (*) [5])"ft^2");
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_60->_M_dataplus)._M_p;
    }
    psVar4 = (string *)0x39;
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x39,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::N + 4),(unit_data *)((long)&units::N + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_58.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  local_4c = 0;
  local_50 = uVar2;
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,(uint64_t)psVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(N * N)","\"N^2\"",&local_48,(char (*) [4])"N^2");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::mm + 4),(unit_data *)((long)&units::mm + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_58.data_ = (AssertHelperData *)0x3eb0c6f7c0000000;
  local_4c = 0;
  local_50 = uVar2;
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,0x3eb0c6f7c0000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_68,"to_string(mm * mm)","\"mm^2\"",&local_48,(char (*) [5])0x1f97f6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::mm + 4),(unit_data *)((long)&units::mm + 4));
  local_20 = (ulong)(uint)uVar2 << 0x20 | 0x358637be;
  uVar2 = units::detail::unit_data::inv((unit_data *)((long)&local_20 + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_58.data_ = (AssertHelperData *)0x412e847fc0000000;
  local_4c = 0;
  psVar4 = &local_48;
  local_50 = uVar2;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_58,ppVar3,0x412e847fc0000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            (local_68,"to_string((mm * mm).inv())","\"1/mm^2\"",psVar4,(char (*) [7])"1/mm^2");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_60->_M_dataplus)._M_p;
    }
    psVar4 = (string *)0x3c;
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::Hz + 4),(unit_data *)((long)&units::Hz + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_58.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  local_4c = 0;
  local_50 = uVar2;
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,(uint64_t)psVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_68,"to_string(Hz * Hz)","\"Hz^2\"",&local_48,(char (*) [5])"Hz^2");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST(unitStrings, squared)
{
    EXPECT_EQ(to_string(ft.pow(2)), "ft^2");
    EXPECT_EQ(to_string(N * N), "N^2");
    EXPECT_EQ(to_string(mm * mm), "mm^2");
    EXPECT_EQ(to_string((mm * mm).inv()), "1/mm^2");
    EXPECT_EQ(to_string(Hz * Hz), "Hz^2");
}